

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_remove_range(void **param_1)

{
  bool bVar1;
  Roaring r1;
  Roaring r2;
  
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,0,5);
  bVar1 = roaring::Roaring::isEmpty(&r1);
  _assert_true((ulong)bVar1,"r1.isEmpty()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x310);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,0,3);
  roaring::Roaring::bitmapOf(&r2,1,4);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x318);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,0,2);
  roaring::Roaring::bitmapOf(&r2,1,4);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,799);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,3,5);
  roaring::Roaring::bitmapOf(&r2,2,1,2);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x327);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,2,5);
  roaring::Roaring::bitmapOf(&r2,1,1);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x32e);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,3,3);
  roaring::Roaring::bitmapOf(&r2,3,1,2,4);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x335);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,0,0);
  roaring::Roaring::bitmapOf(&r2,3,1,2,4);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x33c);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,5,6);
  roaring::Roaring::bitmapOf(&r2,3,1,2,4);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x343);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,2,4);
  roaring::Roaring::removeRangeClosed(&r1,2,1);
  roaring::Roaring::bitmapOf(&r2,3,1,2,4);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x34a);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_remove_range) {
    {
        // min < r1.minimum, max > r1.maximum
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(0, 5);
        assert_true(r1.isEmpty());
    }
    {
        // min < r1.minimum, max < r1.maximum, max does not exactly match an
        // element
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(0, 3);
        Roaring r2 = Roaring::bitmapOf(1, 4);
        assert_true(r1 == r2);
    }
    {
        // min < r1.minimum, max < r1.maximum, max exactly matches an element
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(0, 2);
        Roaring r2 = Roaring::bitmapOf(1, 4);
        assert_true(r1 == r2);
    }
    {
        // min > r1.minimum, max > r1.maximum, min does not exactly match an
        // element
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(3, 5);
        Roaring r2 = Roaring::bitmapOf(2, 1, 2);
        assert_true(r1 == r2);
    }
    {
        // min > r1.minimum, max > r1.maximum, min exactly matches an element
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(2, 5);
        Roaring r2 = Roaring::bitmapOf(1, 1);
        assert_true(r1 == r2);
    }
    {
        // min > r1.minimum, max < r1.maximum, no elements between min and max
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(3, 3);
        Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
        assert_true(r1 == r2);
    }
    {
        // max < r1.minimum
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(0, 0);
        Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
        assert_true(r1 == r2);
    }
    {
        // min > r1.maximum
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(5, 6);
        Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
        assert_true(r1 == r2);
    }
    {
        // min > max
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(2, 1);
        Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
        assert_true(r1 == r2);
    }
}